

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O0

bool __thiscall NJamSpell::TSpellCorrector::LoadCache(TSpellCorrector *this,string *cacheFile)

{
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> uVar1;
  byte bVar2;
  __uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
  _Var3;
  TBloomFilter *pTVar4;
  pointer pTVar5;
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> local_260;
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> deletes2;
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> deletes1;
  uint64_t checkSum;
  uint64_t magicByte;
  undefined4 local_238;
  uint16_t version;
  istream local_228 [8];
  ifstream in;
  string *cacheFile_local;
  TSpellCorrector *this_local;
  
  std::ifstream::ifstream(local_228,(string *)cacheFile,_S_bin);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    this_local._7_1_ = false;
    local_238 = 1;
  }
  else {
    magicByte._6_2_ = 0;
    checkSum = 0;
    NHandyPack::Load<unsigned_long>(local_228,&checkSum);
    if (checkSum == 0x34e5602a26004436) {
      NHandyPack::Load<unsigned_short>(local_228,(unsigned_short *)((long)&magicByte + 6));
      if (magicByte._6_2_ == 1) {
        deletes1._M_t.
        super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
        ._M_t.
        super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
        .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
             (__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
              )(__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                )0x0;
        NHandyPack::Load<unsigned_long>(local_228,(unsigned_long *)&deletes1);
        uVar1 = deletes1;
        _Var3.
        super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
        ._M_t.
        super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
        .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
             (__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
              )TLangModel::GetCheckSum(&this->LangModel);
        if ((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            )uVar1._M_t.
             super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
             .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl ==
            _Var3.
            super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ._M_t.
            super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
            .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl) {
          pTVar4 = (TBloomFilter *)operator_new(8);
          TBloomFilter::TBloomFilter(pTVar4);
          std::unique_ptr<NJamSpell::TBloomFilter,std::default_delete<NJamSpell::TBloomFilter>>::
          unique_ptr<std::default_delete<NJamSpell::TBloomFilter>,void>
                    ((unique_ptr<NJamSpell::TBloomFilter,std::default_delete<NJamSpell::TBloomFilter>>
                      *)&deletes2,pTVar4);
          pTVar4 = (TBloomFilter *)operator_new(8);
          TBloomFilter::TBloomFilter(pTVar4);
          std::unique_ptr<NJamSpell::TBloomFilter,std::default_delete<NJamSpell::TBloomFilter>>::
          unique_ptr<std::default_delete<NJamSpell::TBloomFilter>,void>
                    ((unique_ptr<NJamSpell::TBloomFilter,std::default_delete<NJamSpell::TBloomFilter>>
                      *)&local_260,pTVar4);
          pTVar5 = std::
                   unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                   ::operator->(&deletes2);
          TBloomFilter::Load(pTVar5,local_228);
          pTVar5 = std::
                   unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                   ::operator->(&local_260);
          TBloomFilter::Load(pTVar5,local_228);
          checkSum = 0;
          NHandyPack::Load<unsigned_long>(local_228,&checkSum);
          this_local._7_1_ = checkSum == 0x34e5602a26004436;
          if (this_local._7_1_) {
            std::unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ::operator=(&this->Deletes1,&deletes2);
            std::unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
            ::operator=(&this->Deletes2,&local_260);
          }
          local_238 = 1;
          std::unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>::
          ~unique_ptr(&local_260);
          std::unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>::
          ~unique_ptr(&deletes2);
        }
        else {
          this_local._7_1_ = false;
          local_238 = 1;
        }
      }
      else {
        this_local._7_1_ = false;
        local_238 = 1;
      }
    }
    else {
      this_local._7_1_ = false;
      local_238 = 1;
    }
  }
  std::ifstream::~ifstream(local_228);
  return this_local._7_1_;
}

Assistant:

bool TSpellCorrector::LoadCache(const std::string& cacheFile) {
    std::ifstream in(cacheFile, std::ios::binary);
    if (!in.is_open()) {
        return false;
    }
    uint16_t version = 0;
    uint64_t magicByte = 0;
    NHandyPack::Load(in, magicByte);
    if (magicByte != SPELL_CHECKER_CACHE_MAGIC_BYTE) {
        return false;
    }
    NHandyPack::Load(in, version);
    if (version != SPELL_CHECKER_CACHE_VERSION) {
        return false;
    }
    uint64_t checkSum = 0;
    NHandyPack::Load(in, checkSum);
    if (checkSum != LangModel.GetCheckSum()) {
        return false;
    }
    std::unique_ptr<TBloomFilter> deletes1(new TBloomFilter());
    std::unique_ptr<TBloomFilter> deletes2(new TBloomFilter());
    deletes1->Load(in);
    deletes2->Load(in);
    magicByte = 0;
    NHandyPack::Load(in, magicByte);
    if (magicByte != SPELL_CHECKER_CACHE_MAGIC_BYTE) {
        return false;
    }
    Deletes1 = std::move(deletes1);
    Deletes2 = std::move(deletes2);
    return true;
}